

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O3

void __thiscall httpparser::Response::~Response(Response *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  pcVar2 = (this->status)._M_dataplus._M_p;
  paVar1 = &(this->status).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->content).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>::
  ~vector(&this->headers);
  return;
}

Assistant:

Response()
        : versionMajor(0), versionMinor(0), keepAlive(false), statusCode(0)
    {}